

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyweight_test.cc
# Opt level: O1

int main(void)

{
  pointer pcVar1;
  int iVar2;
  BoxFactory *this;
  Box *pBVar3;
  string color;
  string local_c0;
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  string local_40;
  
  this = (BoxFactory *)operator_new(0x40);
  (this->map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->map)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->map)._M_h._M_rehash_policy = 0;
  (this->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->box).
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Box_*>,_true>
  ._M_cur = (__node_type *)0x0;
  (this->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map)._M_h._M_element_count = 0;
  (this->map)._M_h._M_buckets = &(this->map)._M_h._M_single_bucket;
  (this->map)._M_h._M_bucket_count = 1;
  (this->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->box).
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Box_*>,_true>
  ._M_cur = (__node_type *)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"red","");
  pBVar3 = BoxFactory::getBox(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"red","");
  BoxFactory::getBox(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (pBVar3->color)._M_dataplus._M_p;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + (pBVar3->color)._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_80);
  if (iVar2 != 0) {
    __assert_fail("color == \"red\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/flyweight_test.cc"
                  ,0xd,"int main()");
  }
  if ((int)(this->map)._M_h._M_element_count != 1) {
    __assert_fail("boxcount == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/flyweight_test.cc"
                  ,0x10,"int main()");
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"green","");
  BoxFactory::getBox(this,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"green","");
  BoxFactory::getBox(this,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((int)(this->map)._M_h._M_element_count == 2) {
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    return 0;
  }
  __assert_fail("boxcount == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/flyweight_test.cc"
                ,0x16,"int main()");
}

Assistant:

int main() {
  BoxFactory* boxFactory = new BoxFactory();
  Box* redBox = boxFactory->getBox("red");
  boxFactory->getBox("red");

  std::string color = redBox->getColor();
  assert(color == "red");

  int boxcount = boxFactory->boxCount();
  assert(boxcount == 1);

  boxFactory->getBox("green");
  boxFactory->getBox("green");

  boxcount = boxFactory->boxCount();
  assert(boxcount == 2);
}